

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configparser.h
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
* phyr::RenderConfig::createSupportedConfigMap_abi_cxx11_(void)

{
  mapped_type *this;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
  *in_RDI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
  *config;
  key_type *in_stack_fffffffffffffee8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
  *in_stack_fffffffffffffef0;
  allocator local_b9;
  string local_b8 [32];
  undefined4 local_98;
  allocator local_91;
  string local_90 [32];
  undefined4 local_70;
  allocator local_69;
  string local_68 [32];
  undefined4 local_48;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
                   *)0x18cb79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"resolution",&local_31);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
  ::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_48 = 0;
  std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::push_back
            ((vector<phyr::ParamType,_std::allocator<phyr::ParamType>_> *)in_stack_fffffffffffffef0,
             (value_type *)in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"resolution",&local_69);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
  ::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_70 = 0;
  std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::push_back
            ((vector<phyr::ParamType,_std::allocator<phyr::ParamType>_> *)in_stack_fffffffffffffef0,
             (value_type *)in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"samples",&local_91);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
  ::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_98 = 0;
  std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::push_back
            ((vector<phyr::ParamType,_std::allocator<phyr::ParamType>_> *)in_stack_fffffffffffffef0,
             (value_type *)in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"bounces",&local_b9);
  this = std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
         ::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::push_back
            (this,(value_type *)in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return in_RDI;
}

Assistant:

static std::unordered_map<std::string, std::vector<ParamType>> createSupportedConfigMap() {
        std::unordered_map<std::string, std::vector<ParamType>> config;
        // Image resolution
        config["resolution"].push_back(ParamType::INT);
        config["resolution"].push_back(ParamType::INT);

        // Samples per pixel
        config["samples"].push_back(ParamType::INT);

        // Max-bounces
        config["bounces"].push_back(ParamType::INT);
        return config;
    }